

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O1

void __thiscall wasm::StackIROptimizer::local2Stack(StackIROptimizer *this)

{
  Op OVar1;
  StackInst *inst;
  pointer puVar2;
  Expression *pEVar3;
  _Base_ptr p_Var4;
  pointer pvVar5;
  Index IVar6;
  pointer ppSVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  undefined1 local_1a0 [8];
  LocalGraph localGraph;
  LocalSet *set;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  savedValues;
  key_type local_68;
  LocalGet *get;
  Index null;
  iterator iStack_50;
  uint *local_48;
  uint local_34;
  
  LocalGraph::LocalGraph((LocalGraph *)local_1a0,this->func);
  LocalGraph::computeSetInfluences((LocalGraph *)local_1a0);
  get._0_4_ = 0xffffffff;
  local_48 = (uint *)0x0;
  _null = (uint *)0x0;
  iStack_50._M_current = (uint *)0x0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  set = (LocalSet *)0x0;
  savedValues.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_34 = 0;
  ppSVar7 = (this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->insts->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppSVar7) {
    uVar10 = 0;
    do {
      inst = ppSVar7[uVar10];
      if (inst != (StackInst *)0x0) {
        for (IVar6 = getNumConsumedValues(this,inst); IVar6 != 0; IVar6 = IVar6 - 1) {
          if (iStack_50._M_current == _null) {
            __assert_fail("values.size() > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/StackIR.cpp"
                          ,0x98,"void wasm::StackIROptimizer::local2Stack()");
          }
          while (iStack_50._M_current = iStack_50._M_current + -1,
                *iStack_50._M_current != 0xffffffff) {
            if (iStack_50._M_current == _null) {
              __assert_fail("values.size() > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/StackIR.cpp"
                            ,0x9d,"void wasm::StackIROptimizer::local2Stack()");
            }
          }
        }
        OVar1 = inst->op;
        if (OVar1 < (TryEnd|BlockBegin)) {
          if ((0x18a4U >> (OVar1 & 0x1f) & 1) == 0) {
            if ((0x14aU >> (OVar1 & 0x1f) & 1) == 0) {
              pvVar5 = savedValues.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (OVar1 == Basic) goto LAB_00861fa8;
            }
            else {
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)&set,(value_type *)&null);
            }
            goto LAB_00861f56;
          }
          if (set == (LocalSet *)
                     savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
            __assert_fail("!savedValues.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/StackIR.cpp"
                          ,0xaa,"void wasm::StackIROptimizer::local2Stack()");
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&null,
                     savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1);
          puVar2 = savedValues.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar5 = savedValues.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
          if (puVar2 != (pointer)0x0) {
            pvVar5 = savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -1;
            savedValues.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 savedValues.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
            operator_delete(puVar2,(long)(pvVar5->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar2);
            pvVar5 = savedValues.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        else {
LAB_00861f56:
          pvVar5 = savedValues.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (iStack_50._M_current != _null) {
            iStack_50._M_current = _null;
          }
        }
LAB_00861fa8:
        savedValues.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pvVar5;
        uVar10 = (inst->type).id;
        if (uVar10 < 2) {
          if ((uVar10 == 0) && (inst->origin->_id == LocalSetId)) {
            uVar12 = local_34;
            if (iStack_50._M_current != local_48) goto LAB_00862130;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&null,iStack_50,
                       &local_34);
          }
        }
        else {
          local_68 = (key_type)inst->origin;
          if ((((key_type)inst->origin)->super_SpecificExpression<(wasm::Expression::Id)8>).
              super_Expression._id != LocalGetId) {
            local_68 = (key_type)0x0;
          }
          if ((local_68 != (key_type)0x0) && ((long)iStack_50._M_current - (long)_null != 0)) {
            uVar12 = (int)((ulong)((long)iStack_50._M_current - (long)_null) >> 2) - 1;
            get._4_4_ = 0;
            do {
              uVar10 = (ulong)_null[uVar12];
              if (uVar10 == 0xffffffff) {
LAB_008620f6:
                bVar14 = false;
              }
              else {
                pEVar3 = (this->insts->
                         super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar10]->origin;
                if (pEVar3->_id != LocalSetId) {
                  __assert_fail("int(_id) == int(T::SpecificId)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                                ,0x314,"T *wasm::Expression::cast() [T = wasm::LocalSet]");
                }
                localGraph.SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)pEVar3;
                if (pEVar3[1]._id == local_68->index) {
                  pmVar8 = std::__detail::
                           _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)local_1a0,&local_68);
                  p_Var4 = (_Base_ptr)
                           (pmVar8->
                           super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                           ).flexible._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  p_Var11 = p_Var4;
                  if (p_Var4 == (_Base_ptr)0x0) {
                    p_Var11 = (_Base_ptr)
                              (pmVar8->
                              super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                              ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
                  }
                  bVar14 = true;
                  if (p_Var11 == (_Base_ptr)0x1) {
                    p_Var11 = p_Var4;
                    if (p_Var4 != (_Base_ptr)0x0) {
                      p_Var11 = (pmVar8->
                                super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                ).flexible._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                    }
                    p_Var11 = p_Var11 + 1;
                    if (p_Var4 == (_Base_ptr)0x0) {
                      p_Var11 = (_Base_ptr)
                                &(pmVar8->
                                 super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                                 ).fixed.super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
                    }
                    if (*(size_t *)p_Var11 ==
                        localGraph.SSAIndexes._M_t._M_impl.super__Rb_tree_header._M_node_count) {
                      pmVar9 = std::__detail::
                               _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                             *)&localGraph.getInfluences._M_h._M_single_bucket,
                                            (key_type *)
                                            &localGraph.SSAIndexes._M_t._M_impl.
                                             super__Rb_tree_header._M_node_count);
                      bVar14 = (pmVar9->_M_h)._M_element_count != 1;
                      if (!bVar14) {
                        if ((key_type)(pmVar9->_M_h)._M_before_begin._M_nxt[1]._M_nxt != local_68) {
                          __assert_fail("*setInfluences.begin() == get",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/StackIR.cpp"
                                        ,199,"void wasm::StackIROptimizer::local2Stack()");
                        }
                        (this->insts->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar10] = (StackInst *)0x0;
                        (this->insts->
                        super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[local_34] = (StackInst *)0x0;
                        _null[uVar12] = 0xffffffff;
                        get._4_4_ = (uint)CONCAT71((int7)((ulong)_null >> 8),1);
                      }
                    }
                  }
                  if (!bVar14) goto LAB_008620f6;
                }
                bVar14 = uVar12 != 0;
                bVar13 = uVar12 == 0;
                uVar12 = uVar12 - 1;
                if (bVar13) {
                  uVar12 = 0;
                }
              }
            } while (bVar14);
            if ((get._4_4_ & 1) != 0) goto LAB_00862158;
          }
          uVar12 = (uint)get;
          if (iStack_50._M_current == local_48) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&null,iStack_50,
                       (uint *)&get);
          }
          else {
LAB_00862130:
            *iStack_50._M_current = uVar12;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
LAB_00862158:
      local_34 = local_34 + 1;
      uVar10 = (ulong)local_34;
      ppSVar7 = (this->insts->
                super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->insts->
                                    super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7 >> 3
                             ));
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&set);
  if (_null != (uint *)0x0) {
    operator_delete(_null,(long)local_48 - (long)_null);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&localGraph.func);
  std::
  _Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&localGraph.getInfluences._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&localGraph.locations._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_**>,_std::_Select1st<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_**>,_std::_Select1st<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
               *)&localGraph.getSetses._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1a0);
  return;
}

Assistant:

void local2Stack() {
    // We use the localGraph to tell us if a get-set pair is indeed
    // a set that is read by that get, and only that get. Note that we run
    // this on the Binaryen IR, so we are assuming that no previous opt
    // has changed the interaction of local operations.
    // TODO: we can do this a lot faster, as we just care about linear
    //       control flow.
    LocalGraph localGraph(func);
    localGraph.computeSetInfluences();
    // We maintain a stack of relevant values. This contains:
    //  * a null for each actual value that the value stack would have
    //  * an index of each LocalSet that *could* be on the value
    //    stack at that location.
    const Index null = -1;
    std::vector<Index> values;
    // We also maintain a stack of values vectors for control flow,
    // saving the stack as we enter and restoring it when we exit.
    std::vector<std::vector<Index>> savedValues;
#ifdef STACK_OPT_DEBUG
    std::cout << "func: " << func->name << '\n' << insts << '\n';
#endif
    for (Index i = 0; i < insts.size(); i++) {
      auto* inst = insts[i];
      if (!inst) {
        continue;
      }
      // First, consume values from the stack as required.
      auto consumed = getNumConsumedValues(inst);
#ifdef STACK_OPT_DEBUG
      std::cout << "  " << i << " : " << *inst << ", " << values.size()
                << " on stack, will consume " << consumed << "\n    ";
      for (auto s : values)
        std::cout << s << ' ';
      std::cout << '\n';
#endif
      // TODO: currently we run dce before this, but if we didn't, we'd need
      //       to handle unreachable code here - it's ok to pop multiple values
      //       there even if the stack is at size 0.
      while (consumed > 0) {
        assert(values.size() > 0);
        // Whenever we hit a possible stack value, kill it - it would
        // be consumed here, so we can never optimize to it.
        while (values.back() != null) {
          values.pop_back();
          assert(values.size() > 0);
        }
        // Finally, consume the actual value that is consumed here.
        values.pop_back();
        consumed--;
      }
      // After consuming, we can see what to do with this. First, handle
      // control flow.
      if (isControlFlowBegin(inst)) {
        // Save the stack for when we end this control flow.
        savedValues.push_back(values); // TODO: optimize copies
        values.clear();
      } else if (isControlFlowEnd(inst)) {
        assert(!savedValues.empty());
        values = savedValues.back();
        savedValues.pop_back();
      } else if (isControlFlow(inst)) {
        // Otherwise, in the middle of control flow, just clear it
        values.clear();
      }
      // This is something we should handle, look into it.
      if (inst->type.isConcrete()) {
        bool optimized = false;
        if (auto* get = inst->origin->dynCast<LocalGet>()) {
          // This is a potential optimization opportunity! See if we
          // can reach the set.
          if (values.size() > 0) {
            Index j = values.size() - 1;
            while (1) {
              // If there's an actual value in the way, we've failed.
              auto index = values[j];
              if (index == null) {
                break;
              }
              auto* set = insts[index]->origin->cast<LocalSet>();
              if (set->index == get->index) {
                // This might be a proper set-get pair, where the set is
                // used by this get and nothing else, check that.
                auto& sets = localGraph.getSetses[get];
                if (sets.size() == 1 && *sets.begin() == set) {
                  auto& setInfluences = localGraph.setInfluences[set];
                  if (setInfluences.size() == 1) {
                    assert(*setInfluences.begin() == get);
                    // Do it! The set and the get can go away, the proper
                    // value is on the stack.
#ifdef STACK_OPT_DEBUG
                    std::cout << "  stackify the get\n";
#endif
                    insts[index] = nullptr;
                    insts[i] = nullptr;
                    // Continuing on from here, replace this on the stack
                    // with a null, representing a regular value. We
                    // keep possible values above us active - they may
                    // be optimized later, as they would be pushed after
                    // us, and used before us, so there is no conflict.
                    values[j] = null;
                    optimized = true;
                    break;
                  }
                }
              }
              // We failed here. Can we look some more?
              if (j == 0) {
                break;
              }
              j--;
            }
          }
        }
        if (!optimized) {
          // This is an actual regular value on the value stack.
          values.push_back(null);
        }
      } else if (inst->origin->is<LocalSet>() && inst->type == Type::none) {
        // This set is potentially optimizable later, add to stack.
        values.push_back(i);
      }
    }
  }